

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int json_next_token(JSParseState *s)

{
  BOOL BVar1;
  int iVar2;
  uint uVar3;
  JSAtom JVar4;
  JSParseState *in_RDI;
  JSValue v;
  uint8_t **in_stack_00000008;
  JSToken *in_stack_00000010;
  uint8_t *in_stack_00000018;
  int radix;
  int flags;
  JSValue ret;
  JSAtom atom;
  int c;
  uint8_t *p;
  int in_stack_00000054;
  uint8_t **in_stack_00000058;
  JSParseState *in_stack_00000060;
  int in_stack_00000088;
  int in_stack_0000008c;
  char **in_stack_00000090;
  char *in_stack_00000098;
  JSContext *in_stack_000000a0;
  JSToken *in_stack_ffffffffffffffa8;
  JSRuntime *in_stack_ffffffffffffffb0;
  JSValueUnion local_48;
  int64_t local_40;
  byte *local_18;
  JSParseState *local_10;
  
  local_10 = in_RDI;
  BVar1 = js_check_stack_overflow(in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
  if (BVar1 != 0) {
    iVar2 = js_parse_error(local_10,"stack overflow");
    return iVar2;
  }
  free_token((JSParseState *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_18 = local_10->buf_ptr;
  local_10->last_ptr = local_18;
  local_10->last_line_num = (local_10->token).line_num;
LAB_00146de9:
  (local_10->token).line_num = local_10->line_num;
  (local_10->token).ptr = local_18;
  uVar3 = (uint)*local_18;
  switch(uVar3) {
  case 0:
    if (local_18 < local_10->buf_end) {
LAB_0014729b:
      (local_10->token).val = uVar3;
      local_18 = local_18 + 1;
    }
    else {
      (local_10->token).val = -0x56;
    }
LAB_001472b5:
    local_10->buf_ptr = local_18;
    return 0;
  default:
    if (0x7f < uVar3) {
      js_parse_error(local_10,"unexpected character");
      goto LAB_001472cd;
    }
    goto LAB_0014729b;
  case 9:
  case 0x20:
    goto switchD_00146e34_caseD_9;
  case 10:
    goto switchD_00146e34_caseD_a;
  case 0xb:
  case 0xc:
    if (local_10->ext_json == 0) goto LAB_0014729b;
switchD_00146e34_caseD_9:
    local_18 = local_18 + 1;
    goto LAB_00146de9;
  case 0xd:
    if (local_18[1] == 10) {
      local_18 = local_18 + 1;
    }
switchD_00146e34_caseD_a:
    local_18 = local_18 + 1;
    local_10->line_num = local_10->line_num + 1;
    goto LAB_00146de9;
  case 0x22:
    goto switchD_00146e34_caseD_22;
  case 0x24:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5f:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x79:
  case 0x7a:
    local_18 = local_18 + 1;
    JVar4 = json_parse_ident(in_stack_00000060,in_stack_00000058,in_stack_00000054);
    if (JVar4 == 0) goto LAB_001472cd;
    (local_10->token).u.ident.atom = JVar4;
    (local_10->token).u.ident.has_escape = 0;
    (local_10->token).u.ident.is_reserved = 0;
    (local_10->token).val = -0x7d;
    goto LAB_001472b5;
  case 0x27:
    if (local_10->ext_json == 0) goto LAB_0014729b;
switchD_00146e34_caseD_22:
    iVar2 = js_parse_string((JSParseState *)ret.u.ptr,flags,radix,in_stack_00000018,
                            in_stack_00000010,in_stack_00000008);
    if (iVar2 != 0) goto LAB_001472cd;
    goto LAB_001472b5;
  case 0x2b:
    if (local_10->ext_json != 0) {
      iVar2 = is_digit((uint)local_18[1]);
      goto joined_r0x001471c9;
    }
    goto LAB_0014729b;
  case 0x2d:
    iVar2 = is_digit((uint)local_18[1]);
joined_r0x001471c9:
    if (iVar2 == 0) goto LAB_0014729b;
    break;
  case 0x2f:
    if (local_10->ext_json == 0) goto LAB_0014729b;
    if (local_18[1] != 0x2a) {
      if (local_18[1] == 0x2f) goto code_r0x00147054;
      goto LAB_0014729b;
    }
    local_18 = local_18 + 2;
    while( true ) {
      if ((*local_18 == 0) && (local_10->buf_end <= local_18)) {
        js_parse_error(local_10,"unexpected end of comment");
        goto LAB_001472cd;
      }
      if ((*local_18 == 0x2a) && (local_18[1] == 0x2f)) break;
      if (*local_18 == 10) {
        local_10->line_num = local_10->line_num + 1;
        local_18 = local_18 + 1;
      }
      else if (*local_18 == 0xd) {
        local_18 = local_18 + 1;
      }
      else if (*local_18 < 0x80) {
        local_18 = local_18 + 1;
      }
      else {
        iVar2 = unicode_from_utf8(local_18,6,&local_18);
        if (iVar2 == -1) {
          local_18 = local_18 + 1;
        }
      }
    }
    local_18 = local_18 + 2;
    goto LAB_00146de9;
  case 0x30:
    iVar2 = is_digit((uint)local_18[1]);
    if (iVar2 != 0) goto LAB_0014729b;
    break;
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  }
  v = js_atof(in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_0000008c,
              in_stack_00000088);
  local_48 = v.u;
  local_40 = v.tag;
  iVar2 = JS_IsException(v);
  if (iVar2 != 0) {
LAB_001472cd:
    (local_10->token).val = -0x58;
    return -1;
  }
  (local_10->token).val = -0x80;
  (local_10->token).u.str.str.u = local_48;
  (local_10->token).u.str.str.tag = local_40;
  goto LAB_001472b5;
code_r0x00147054:
  local_18 = local_18 + 2;
  while ((((*local_18 != 0 || (local_18 < local_10->buf_end)) && (*local_18 != 0xd)) &&
         (*local_18 != 10))) {
    if (*local_18 < 0x80) {
      local_18 = local_18 + 1;
    }
    else {
      iVar2 = unicode_from_utf8(local_18,6,&local_18);
      if ((iVar2 == 0x2028) || (iVar2 == 0x2029)) break;
      if (iVar2 == -1) {
        local_18 = local_18 + 1;
      }
    }
  }
  goto LAB_00146de9;
}

Assistant:

static __exception int json_next_token(JSParseState *s)
{
    const uint8_t *p;
    int c;
    JSAtom atom;
    
    if (js_check_stack_overflow(s->ctx->rt, 0)) {
        return js_parse_error(s, "stack overflow");
    }
    
    free_token(s, &s->token);

    p = s->last_ptr = s->buf_ptr;
    s->last_line_num = s->token.line_num;
 redo:
    s->token.line_num = s->line_num;
    s->token.ptr = p;
    c = *p;
    switch(c) {
    case 0:
        if (p >= s->buf_end) {
            s->token.val = TOK_EOF;
        } else {
            goto def_token;
        }
        break;
    case '\'':
        if (!s->ext_json) {
            /* JSON does not accept single quoted strings */
            goto def_token;
        }
        /* fall through */
    case '\"':
        if (js_parse_string(s, c, TRUE, p + 1, &s->token, &p))
            goto fail;
        break;
    case '\r':  /* accept DOS and MAC newline sequences */
        if (p[1] == '\n') {
            p++;
        }
        /* fall thru */
    case '\n':
        p++;
        s->line_num++;
        goto redo;
    case '\f':
    case '\v':
        if (!s->ext_json) {
            /* JSONWhitespace does not match <VT>, nor <FF> */
            goto def_token;
        }
        /* fall through */
    case ' ':
    case '\t':
        p++;
        goto redo;
    case '/':
        if (!s->ext_json) {
            /* JSON does not accept comments */
            goto def_token;
        }
        if (p[1] == '*') {
            /* comment */
            p += 2;
            for(;;) {
                if (*p == '\0' && p >= s->buf_end) {
                    js_parse_error(s, "unexpected end of comment");
                    goto fail;
                }
                if (p[0] == '*' && p[1] == '/') {
                    p += 2;
                    break;
                }
                if (*p == '\n') {
                    s->line_num++;
                    p++;
                } else if (*p == '\r') {
                    p++;
                } else if (*p >= 0x80) {
                    c = unicode_from_utf8(p, UTF8_CHAR_LEN_MAX, &p);
                    if (c == -1) {
                        p++; /* skip invalid UTF-8 */
                    }
                } else {
                    p++;
                }
            }
            goto redo;
        } else if (p[1] == '/') {
            /* line comment */
            p += 2;
            for(;;) {
                if (*p == '\0' && p >= s->buf_end)
                    break;
                if (*p == '\r' || *p == '\n')
                    break;
                if (*p >= 0x80) {
                    c = unicode_from_utf8(p, UTF8_CHAR_LEN_MAX, &p);
                    /* LS or PS are considered as line terminator */
                    if (c == CP_LS || c == CP_PS) {
                        break;
                    } else if (c == -1) {
                        p++; /* skip invalid UTF-8 */
                    }
                } else {
                    p++;
                }
            }
            goto redo;
        } else {
            goto def_token;
        }
        break;
    case 'a': case 'b': case 'c': case 'd':
    case 'e': case 'f': case 'g': case 'h':
    case 'i': case 'j': case 'k': case 'l':
    case 'm': case 'n': case 'o': case 'p':
    case 'q': case 'r': case 's': case 't':
    case 'u': case 'v': case 'w': case 'x':
    case 'y': case 'z': 
    case 'A': case 'B': case 'C': case 'D':
    case 'E': case 'F': case 'G': case 'H':
    case 'I': case 'J': case 'K': case 'L':
    case 'M': case 'N': case 'O': case 'P':
    case 'Q': case 'R': case 'S': case 'T':
    case 'U': case 'V': case 'W': case 'X':
    case 'Y': case 'Z': 
    case '_':
    case '$':
        /* identifier : only pure ascii characters are accepted */
        p++;
        atom = json_parse_ident(s, &p, c);
        if (atom == JS_ATOM_NULL)
            goto fail;
        s->token.u.ident.atom = atom;
        s->token.u.ident.has_escape = FALSE;
        s->token.u.ident.is_reserved = FALSE;
        s->token.val = TOK_IDENT;
        break;
    case '+':
        if (!s->ext_json || !is_digit(p[1]))
            goto def_token;
        goto parse_number;
    case '0':
        if (is_digit(p[1]))
            goto def_token;
        goto parse_number;
    case '-':
        if (!is_digit(p[1]))
            goto def_token;
        goto parse_number;
    case '1': case '2': case '3': case '4':
    case '5': case '6': case '7': case '8':
    case '9': 
        /* number */
    parse_number:
        {
            JSValue ret;
            int flags, radix;
            if (!s->ext_json) {
                flags = 0;
                radix = 10;
            } else {
                flags = ATOD_ACCEPT_BIN_OCT;
                radix = 0;
            }
            ret = js_atof(s->ctx, (const char *)p, (const char **)&p, radix,
                          flags);
            if (JS_IsException(ret))
                goto fail;
            s->token.val = TOK_NUMBER;
            s->token.u.num.val = ret;
        }
        break;
    default:
        if (c >= 128) {
            js_parse_error(s, "unexpected character");
            goto fail;
        }
    def_token:
        s->token.val = c;
        p++;
        break;
    }
    s->buf_ptr = p;

    //    dump_token(s, &s->token);
    return 0;

 fail:
    s->token.val = TOK_ERROR;
    return -1;
}